

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O2

void sc_import(limb_t *dst,uint8_t *src,size_t len)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  byte *pbVar4;
  ulong uVar5;
  lsc_t tmp;
  ulong local_58 [11];
  
  pbVar4 = src + len;
  uVar5 = 0;
  iVar3 = 0;
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
    for (; (src < pbVar4 && (iVar3 < 0x34)); iVar3 = iVar3 + 8) {
      bVar1 = *src;
      src = src + 1;
      uVar5 = uVar5 | (ulong)bVar1 << ((byte)iVar3 & 0x3f);
    }
    local_58[lVar2] = uVar5 & 0xfffffffffffff;
    uVar5 = uVar5 >> 0x34;
    iVar3 = iVar3 + -0x34;
  }
  sc_barrett(dst,(limb_t *)local_58);
  return;
}

Assistant:

void
sc_import(sc_t dst, const uint8_t *src, size_t len)
{
	const uint8_t *endp = src + len;
	lsc_t tmp;
	uint64_t foo;
	int i, fill;

	fill = 0;
	foo = 0;
	for (i = 0; i < 2*K; i++) {
		while (src < endp && fill < LB) {
			foo |= (uint64_t)*src++ << fill;
			fill += 8;
		}
		
		tmp[i] = foo & MSK;

		foo >>= LB;
		fill -= LB;
	}

	sc_barrett(dst, tmp);
}